

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

size_t skip_line_splice(Source_File *src)

{
  bool bVar1;
  size_t local_18;
  size_t current_size;
  Source_File *src_local;
  
  local_18 = 0;
  while( true ) {
    bVar1 = false;
    if ((src->where_in_src < src->src_size - 1) &&
       (bVar1 = false, src->src[src->where_in_src] == '\\')) {
      bVar1 = src->src[src->where_in_src + 1] == '\n';
    }
    if (!bVar1) break;
    src->where_in_src = src->where_in_src + 2;
    local_18 = local_18 + 2;
  }
  return local_18;
}

Assistant:

size_t skip_line_splice(struct Source_File *src)
{
	size_t current_size=0;
	while(src->where_in_src<src->src_size-1 && src->src[src->where_in_src]=='\\' && src->src[src->where_in_src+1]=='\n')
	{
		src->where_in_src+=2;
		current_size+=2;
	}
	return current_size;
}